

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

uint __thiscall Js::ByteCodeWriter::EnterLoop(ByteCodeWriter *this,ByteCodeLabel loopEntrance)

{
  Type *pTVar1;
  uint uVar2;
  int iVar3;
  Type pLVar4;
  code *pcVar5;
  bool bVar6;
  uint32 C1;
  int iVar7;
  undefined4 *puVar8;
  OpCode op;
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  
  if (this->useBranchIsland == true) {
    EnsureLongBranch(this,StatementBoundary);
  }
  C1 = FunctionBody::IncreaseCountField(this->m_functionWrite,LoopCount);
  this_00 = this->m_loopHeaders;
  if ((this_00->
      super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
      ).count != C1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xc9a,"((uint)m_loopHeaders->Count() == loopId)",
                                "(uint)m_loopHeaders->Count() == loopId");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
    this_00 = this->m_loopHeaders;
  }
  uVar2 = (this->m_byteCodeData).currentOffset;
  iVar7 = this->m_loopNest;
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_00,0);
  pLVar4 = (this_00->
           super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
           ).buffer;
  iVar3 = (this_00->
          super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  pLVar4[iVar3].startOffset = uVar2;
  pLVar4[iVar3].endOffset = 0;
  pLVar4[iVar3].isNested = 0 < iVar7;
  pLVar4[iVar3].hasYield = false;
  pTVar1 = &(this_00->
            super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
  *pTVar1 = *pTVar1 + 1;
  iVar7 = this->m_loopNest + 1;
  this->m_loopNest = iVar7;
  *(uint *)&this->m_functionWrite->field_0x178 =
       *(uint *)&this->m_functionWrite->field_0x178 & 0xfffeffff | (uint)(1 < iVar7) << 0x10;
  bVar6 = DynamicProfileInfo::EnableImplicitCallFlags(this->m_functionWrite);
  op = LoopBodyStart;
  if (bVar6) {
    Unsigned1(this,ProfiledLoopStart,C1);
    op = ProfiledLoopBodyStart;
  }
  MarkLabel(this,loopEntrance);
  if ((this->m_doJitLoopBodies != false) || (this->m_doInterruptProbe == true)) {
    Unsigned1(this,op,C1);
  }
  return C1;
}

Assistant:

uint ByteCodeWriter::EnterLoop(Js::ByteCodeLabel loopEntrance)
    {
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            // If we are going to emit a branch island, it should be before the loop header
            this->EnsureLongBranch(Js::OpCode::StatementBoundary);
        }
#endif

        uint loopId = m_functionWrite->IncrLoopCount();
        Assert((uint)m_loopHeaders->Count() == loopId);

        m_loopHeaders->Add(LoopHeaderData(m_byteCodeData.GetCurrentOffset(), 0, m_loopNest > 0, false));
        m_loopNest++;
        m_functionWrite->SetHasNestedLoop(m_loopNest > 1);

        Js::OpCode loopBodyOpcode = Js::OpCode::LoopBodyStart;
#if ENABLE_PROFILE_INFO
        if (Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionWrite()))
        {
            this->Unsigned1(Js::OpCode::ProfiledLoopStart, loopId);
            loopBodyOpcode = Js::OpCode::ProfiledLoopBodyStart;
        }
#endif

        this->MarkLabel(loopEntrance);
        if (this->DoJitLoopBodies() || this->DoInterruptProbes())
        {
            this->Unsigned1(loopBodyOpcode, loopId);
        }

        return loopId;
    }